

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetAppBundleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          BundleDirectoryLevel level)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  cmValue cVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  size_type __dnew;
  string local_b0;
  string local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_58;
  undefined8 local_40;
  undefined1 *local_38;
  undefined8 local_30;
  
  GetFullName(&local_78,this,config,RuntimeBinaryArtifact);
  local_58.first._M_len = local_78._M_string_length;
  local_58.first._M_str = local_78._M_dataplus._M_p;
  local_b0.field_2._M_allocated_capacity = (long)&local_b0.field_2 + 8;
  local_b0._M_dataplus._M_p = (pointer)0x0;
  local_b0._M_string_length = 1;
  local_b0.field_2._M_local_buf[8] = '.';
  local_40 = 1;
  local_30 = 0;
  views._M_len = 2;
  views._M_array = &local_58;
  local_58.second = &local_78;
  local_38 = (undefined1 *)local_b0.field_2._M_allocated_capacity;
  cmCatViews(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_b0.field_2;
  local_58.first._M_len = 0x10;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  local_b0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_b0,(ulong)&local_58);
  local_b0.field_2._M_allocated_capacity = local_58.first._M_len;
  builtin_strncpy(local_b0._M_dataplus._M_p,"BUNDLE_EXTENSION",0x10);
  local_b0._M_string_length = local_58.first._M_len;
  local_b0._M_dataplus._M_p[local_58.first._M_len] = '\0';
  cVar4 = GetProperty(this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (cVar4.Value == (string *)0x0) {
    local_b0._M_string_length = 3;
    local_b0.field_2._M_allocated_capacity._0_4_ = 0x707061;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    pcVar2 = ((cVar4.Value)->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (cVar4.Value)->_M_string_length);
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (level - ContentLevel < 2) {
    bVar3 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile);
    if (!bVar3) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (level == FullLevel) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetAppBundleDirectory(
  const std::string& config, BundleDirectoryLevel level) const
{
  std::string fpath = cmStrCat(
    this->GetFullName(config, cmStateEnums::RuntimeBinaryArtifact), '.');
  cmValue ext = this->GetProperty("BUNDLE_EXTENSION");
  fpath += (ext ? *ext : "app");
  if (shouldAddContentLevel(level) &&
      !this->Makefile->PlatformIsAppleEmbedded()) {
    fpath += "/Contents";
    if (shouldAddFullLevel(level)) {
      fpath += "/MacOS";
    }
  }
  return fpath;
}